

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenKeyGetter_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def,
          FieldDef *key_field)

{
  FieldDef *key_field_00;
  FieldDef *struct_def_00;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  FieldDef *local_28;
  FieldDef *key_field_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  local_28 = key_field;
  key_field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"builder.DataBuffer",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"builder.DataBuffer.Length - o1.Value",&local_e1);
  GenGetterForLookupByKey(&local_88,this,struct_def,key_field,&local_a8,&local_e0);
  std::operator+(&local_68,&local_88,".CompareTo(");
  struct_def_00 = key_field_local;
  key_field_00 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"builder.DataBuffer",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"builder.DataBuffer.Length - o2.Value",&local_151);
  GenGetterForLookupByKey
            (&local_108,this,(StructDef *)struct_def_00,key_field_00,&local_128,&local_150);
  std::operator+(&local_48,&local_68,&local_108);
  std::operator+(__return_storage_ptr__,&local_48,")");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return __return_storage_ptr__;
}

Assistant:

std::string GenKeyGetter(flatbuffers::StructDef &struct_def,
                           flatbuffers::FieldDef *key_field) const {
    // Get the getter for the key of the struct.
    return GenGetterForLookupByKey(struct_def, key_field, "builder.DataBuffer",
                                   "builder.DataBuffer.Length - o1.Value") +
           ".CompareTo(" +
           GenGetterForLookupByKey(struct_def, key_field, "builder.DataBuffer",
                                   "builder.DataBuffer.Length - o2.Value") +
           ")";
  }